

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnectionTestCase.cpp
# Opt level: O0

void __thiscall
CATCH2_INTERNAL_TEST_0()::TestSession::TestSession(FIX::Application&,FIX::MessageStoreFactory&,FIX::
SessionID_const&,FIX::DataDictionaryProvider&,FIX::TimeRange_const__int_
          (void *this,Application *app,MessageStoreFactory *factory,SessionID *sessionId,
          DataDictionaryProvider *provider,TimeRange *timeRange,int heartBtInt)

{
  anon_class_1_0_00000001 local_59;
  function<FIX::UtcTimeStamp_()> local_58;
  TimeRange *local_38;
  TimeRange *timeRange_local;
  DataDictionaryProvider *provider_local;
  SessionID *sessionId_local;
  MessageStoreFactory *factory_local;
  Application *app_local;
  TestSession *this_local;
  
  local_38 = timeRange;
  timeRange_local = (TimeRange *)provider;
  provider_local = (DataDictionaryProvider *)sessionId;
  sessionId_local = (SessionID *)factory;
  factory_local = (MessageStoreFactory *)app;
  app_local = (Application *)this;
  std::function<FIX::UtcTimeStamp()>::
  function<CATCH2_INTERNAL_TEST_0()::TestSession::TestSession(FIX::Application&,FIX::MessageStoreFactory&,FIX::SessionID_const&,FIX::DataDictionaryProvider&,FIX::TimeRange_const&,int)::_lambda()_1_,void>
            ((function<FIX::UtcTimeStamp()> *)&local_58,&local_59);
  FIX::Session::Session
            ((Session *)this,&local_58,factory_local,sessionId_local,provider_local,timeRange_local,
             local_38,heartBtInt,0);
  std::function<FIX::UtcTimeStamp_()>::~function(&local_58);
  *(undefined ***)this = &PTR__TestSession_0050b648;
  *(undefined8 *)((long)this + 0x878) = 0;
  *(undefined1 *)((long)this + 0x880) = 0;
  return;
}

Assistant:

TestSession(
        Application &app,
        MessageStoreFactory &factory,
        const SessionID &sessionId,
        DataDictionaryProvider &provider,
        const TimeRange &timeRange,
        int heartBtInt)
        : Session(
              []() { return UtcTimeStamp::now(); },
              app,
              factory,
              sessionId,
              provider,
              timeRange,
              heartBtInt,
              nullptr) {}